

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,unsigned_long value,basic_format_specs<char> *specs)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  unsigned_long uVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong uVar9;
  ulong n;
  
  uVar8 = 2;
  uVar7 = value;
  do {
    uVar8 = uVar8 + 1;
    bVar4 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar4);
  if (specs == (basic_format_specs<char> *)0x0) {
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize((ulong)out.container,(char)sVar2 + (char)uVar8);
    pcVar3 = ((out.container)->_M_dataplus)._M_p;
    pcVar1 = pcVar3 + sVar2;
    pcVar1[0] = '0';
    pcVar1[1] = 'x';
    pcVar5 = pcVar3 + uVar8 + sVar2;
    do {
      pcVar5 = pcVar5 + -1;
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      bVar4 = 0xf < value;
      value = value >> 4;
    } while (bVar4);
  }
  else {
    uVar9 = 0;
    if (uVar8 <= (uint)specs->width) {
      uVar9 = (uint)specs->width - uVar8;
    }
    n = uVar9 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize
              ((ulong)out.container,(specs->fill).size_ * (char)uVar9 + (char)sVar2 + (char)uVar8);
    pcVar5 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,n,&specs->fill);
    pcVar5[0] = '0';
    pcVar5[1] = 'x';
    pcVar6 = pcVar5 + uVar8;
    do {
      pcVar6 = pcVar6 + -1;
      *pcVar6 = "0123456789abcdef"[(uint)value & 0xf];
      bVar4 = 0xf < value;
      value = value >> 4;
    } while (bVar4);
    fill<char*,char>(pcVar5 + uVar8,uVar9 - n,&specs->fill);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}